

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O3

uint32_t __thiscall icu_63::CollationWeights::nextWeight(CollationWeights *this)

{
  int32_t *piVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t weight;
  
  iVar2 = this->rangeIndex;
  weight = 0xffffffff;
  if (iVar2 < this->rangeCount) {
    weight = this->ranges[iVar2].start;
    piVar1 = &this->ranges[iVar2].count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      this->rangeIndex = iVar2 + 1;
    }
    else {
      uVar3 = incWeight(this,weight,this->ranges[iVar2].length);
      this->ranges[iVar2].start = uVar3;
    }
  }
  return weight;
}

Assistant:

uint32_t
CollationWeights::nextWeight() {
    if(rangeIndex >= rangeCount) {
        return 0xffffffff;
    } else {
        /* get the next weight */
        WeightRange &range = ranges[rangeIndex];
        uint32_t weight = range.start;
        if(--range.count == 0) {
            /* this range is finished */
            ++rangeIndex;
        } else {
            /* increment the weight for the next value */
            range.start = incWeight(weight, range.length);
            U_ASSERT(range.start <= range.end);
        }

        return weight;
    }
}